

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateDebugToolItemPicker(void)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImVec4 *col;
  ImGuiID hovered_id;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  GImGui->DebugItemPickerBreakID = 0;
  if ((pIVar2->DebugItemPickerActive & 1U) != 0) {
    uVar1 = pIVar2->HoveredIdPreviousFrame;
    SetMouseCursor(7);
    bVar3 = IsKeyPressedMap(0xe,true);
    if (bVar3) {
      pIVar2->DebugItemPickerActive = false;
    }
    bVar3 = IsMouseClicked(0,false);
    if ((bVar3) && (uVar1 != 0)) {
      pIVar2->DebugItemPickerBreakID = uVar1;
      pIVar2->DebugItemPickerActive = false;
    }
    SetNextWindowBgAlpha(0.6);
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar1);
    Text("Press ESC to abort picking.");
    col = GetStyleColorVec4((uint)(uVar1 == 0));
    TextColored(col,"Click to break in debugger!");
    EndTooltip();
  }
  return;
}

Assistant:

void ImGui::UpdateDebugToolItemPicker()
{
    ImGuiContext& g = *GImGui;
    g.DebugItemPickerBreakID = 0;
    if (g.DebugItemPickerActive)
    {
        const ImGuiID hovered_id = g.HoveredIdPreviousFrame;
        ImGui::SetMouseCursor(ImGuiMouseCursor_Hand);
        if (ImGui::IsKeyPressedMap(ImGuiKey_Escape))
            g.DebugItemPickerActive = false;
        if (ImGui::IsMouseClicked(0) && hovered_id)
        {
            g.DebugItemPickerBreakID = hovered_id;
            g.DebugItemPickerActive = false;
        }
        ImGui::SetNextWindowBgAlpha(0.60f);
        ImGui::BeginTooltip();
        ImGui::Text("HoveredId: 0x%08X", hovered_id);
        ImGui::Text("Press ESC to abort picking.");
        ImGui::TextColored(GetStyleColorVec4(hovered_id ? ImGuiCol_Text : ImGuiCol_TextDisabled), "Click to break in debugger!");
        ImGui::EndTooltip();
    }
}